

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_3dfloors.cpp
# Opt level: O1

void P_RecalculateAttached3DFloors(sector_t *sec)

{
  extsector_t *peVar1;
  ulong uVar2;
  
  peVar1 = sec->e;
  if ((peVar1->XFloor).attached.Count != 0) {
    uVar2 = 0;
    do {
      P_Recalculate3DFloors((peVar1->XFloor).attached.Array[uVar2]);
      uVar2 = uVar2 + 1;
    } while (uVar2 < (peVar1->XFloor).attached.Count);
  }
  P_Recalculate3DFloors(sec);
  return;
}

Assistant:

void P_RecalculateAttached3DFloors(sector_t * sec)
{
	extsector_t::xfloor &x = sec->e->XFloor;

	for(unsigned int i=0; i<x.attached.Size(); i++)
	{
		P_Recalculate3DFloors(x.attached[i]);
	}
	P_Recalculate3DFloors(sec);
}